

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmBinaryOp(ExpressionContext *ctx,VmModule *module,ExprBinaryOp *node)

{
  SynBase *pSVar1;
  SynBase *pSVar2;
  VmValue *pVVar3;
  VmBlock *pVVar4;
  VmBlock *pVVar5;
  VmBlock *pVVar6;
  VmBlock *pVVar7;
  VmConstant *pVVar8;
  VmValue *pVVar9;
  VmInstruction *pVVar10;
  VmInstruction *pVVar11;
  VmValue *local_c0;
  VmValue *result;
  VmValue *rhs;
  VmValue *phi_1;
  VmValue *falseValue_1;
  VmValue *trueValue_1;
  VmValue *rhs_2;
  VmBlock *exitBlock_1;
  VmBlock *storeZeroBlock_1;
  VmBlock *storeOneBlock_1;
  VmBlock *checkRhsBlock_1;
  VmValue *phi;
  VmValue *falseValue;
  VmValue *trueValue;
  VmValue *rhs_1;
  VmBlock *exitBlock;
  VmBlock *storeZeroBlock;
  VmBlock *storeOneBlock;
  VmBlock *checkRhsBlock;
  VmValue *lhs;
  ExprBinaryOp *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar3 = CompileVm(ctx,module,node->lhs);
  if (*(int *)&(node->super_ExprBase).field_0x2c == 0x12) {
    pVVar4 = anon_unknown.dwarf_aa461::CreateBlock
                       (module,(node->super_ExprBase).source,"land_check_rhs");
    pVVar5 = anon_unknown.dwarf_aa461::CreateBlock
                       (module,(node->super_ExprBase).source,"land_store_1");
    pVVar6 = anon_unknown.dwarf_aa461::CreateBlock
                       (module,(node->super_ExprBase).source,"land_store_0");
    pVVar7 = anon_unknown.dwarf_aa461::CreateBlock(module,(node->super_ExprBase).source,"land_exit")
    ;
    anon_unknown.dwarf_aa461::CreateJumpZero
              (module,(node->super_ExprBase).source,pVVar3,&pVVar6->super_VmValue,
               &pVVar4->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar4);
    module->currentBlock = pVVar4;
    pVVar3 = CompileVm(ctx,module,node->rhs);
    anon_unknown.dwarf_aa461::CreateJumpZero
              (module,(node->super_ExprBase).source,pVVar3,&pVVar6->super_VmValue,
               &pVVar5->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar5);
    module->currentBlock = pVVar5;
    pSVar1 = (node->super_ExprBase).source;
    pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,1);
    pVVar3 = anon_unknown.dwarf_aa461::CreateLoadImmediate(module,pSVar1,pVVar8);
    anon_unknown.dwarf_aa461::CreateJump
              (module,(node->super_ExprBase).source,&pVVar7->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar6);
    module->currentBlock = pVVar6;
    pSVar1 = (node->super_ExprBase).source;
    pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    pVVar9 = anon_unknown.dwarf_aa461::CreateLoadImmediate(module,pSVar1,pVVar8);
    anon_unknown.dwarf_aa461::CreateJump
              (module,(node->super_ExprBase).source,&pVVar7->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar7);
    module->currentBlock = pVVar7;
    pSVar1 = (node->super_ExprBase).source;
    pVVar10 = getType<VmInstruction>(pVVar3);
    pVVar11 = getType<VmInstruction>(pVVar9);
    pVVar3 = anon_unknown.dwarf_aa461::CreatePhi(module,pSVar1,pVVar10,pVVar11);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar3);
  }
  else if (*(int *)&(node->super_ExprBase).field_0x2c == 0x13) {
    pVVar4 = anon_unknown.dwarf_aa461::CreateBlock
                       (module,(node->super_ExprBase).source,"lor_check_rhs");
    pVVar5 = anon_unknown.dwarf_aa461::CreateBlock
                       (module,(node->super_ExprBase).source,"lor_store_1");
    pVVar6 = anon_unknown.dwarf_aa461::CreateBlock
                       (module,(node->super_ExprBase).source,"lor_store_0");
    pVVar7 = anon_unknown.dwarf_aa461::CreateBlock(module,(node->super_ExprBase).source,"lor_exit");
    anon_unknown.dwarf_aa461::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar3,&pVVar5->super_VmValue,
               &pVVar4->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar4);
    module->currentBlock = pVVar4;
    pVVar3 = CompileVm(ctx,module,node->rhs);
    anon_unknown.dwarf_aa461::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar3,&pVVar5->super_VmValue,
               &pVVar6->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar5);
    module->currentBlock = pVVar5;
    pSVar1 = (node->super_ExprBase).source;
    pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,1);
    pVVar3 = anon_unknown.dwarf_aa461::CreateLoadImmediate(module,pSVar1,pVVar8);
    anon_unknown.dwarf_aa461::CreateJump
              (module,(node->super_ExprBase).source,&pVVar7->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar6);
    module->currentBlock = pVVar6;
    pSVar1 = (node->super_ExprBase).source;
    pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    pVVar9 = anon_unknown.dwarf_aa461::CreateLoadImmediate(module,pSVar1,pVVar8);
    anon_unknown.dwarf_aa461::CreateJump
              (module,(node->super_ExprBase).source,&pVVar7->super_VmValue);
    VmFunction::AddBlock(module->currentFunction,pVVar7);
    module->currentBlock = pVVar7;
    pSVar1 = (node->super_ExprBase).source;
    pVVar10 = getType<VmInstruction>(pVVar3);
    pVVar11 = getType<VmInstruction>(pVVar9);
    pVVar3 = anon_unknown.dwarf_aa461::CreatePhi(module,pSVar1,pVVar10,pVVar11);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar3);
  }
  else {
    pVVar9 = CompileVm(ctx,module,node->rhs);
    local_c0 = (VmValue *)0x0;
    switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
    case 1:
      local_c0 = anon_unknown.dwarf_aa461::CreateAdd
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 2:
      local_c0 = anon_unknown.dwarf_aa461::CreateSub
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 3:
      local_c0 = anon_unknown.dwarf_aa461::CreateMul
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 4:
      local_c0 = anon_unknown.dwarf_aa461::CreateDiv
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 5:
      local_c0 = anon_unknown.dwarf_aa461::CreateMod
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 6:
      local_c0 = anon_unknown.dwarf_aa461::CreatePow
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 7:
      local_c0 = anon_unknown.dwarf_aa461::CreateShl
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 8:
      local_c0 = anon_unknown.dwarf_aa461::CreateShr
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 9:
      local_c0 = anon_unknown.dwarf_aa461::CreateCompareLess
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 10:
      local_c0 = anon_unknown.dwarf_aa461::CreateCompareLessEqual
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 0xb:
      local_c0 = anon_unknown.dwarf_aa461::CreateCompareGreater
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 0xc:
      local_c0 = anon_unknown.dwarf_aa461::CreateCompareGreaterEqual
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 0xd:
      local_c0 = anon_unknown.dwarf_aa461::CreateCompareEqual
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 0xe:
      local_c0 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 0xf:
      local_c0 = anon_unknown.dwarf_aa461::CreateAnd
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 0x10:
      local_c0 = anon_unknown.dwarf_aa461::CreateOr
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    case 0x11:
      local_c0 = anon_unknown.dwarf_aa461::CreateXor
                           (module,(node->super_ExprBase).source,pVVar3,pVVar9);
      break;
    default:
      break;
    case 0x14:
      pSVar1 = (node->super_ExprBase).source;
      pSVar2 = (node->super_ExprBase).source;
      pVVar8 = CreateConstantZero(module->allocator,(node->super_ExprBase).source,pVVar3->type);
      pVVar3 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                         (module,pSVar2,pVVar3,&pVVar8->super_VmValue);
      pSVar2 = (node->super_ExprBase).source;
      pVVar8 = CreateConstantZero(module->allocator,(node->super_ExprBase).source,pVVar9->type);
      pVVar9 = anon_unknown.dwarf_aa461::CreateCompareNotEqual
                         (module,pSVar2,pVVar9,&pVVar8->super_VmValue);
      local_c0 = anon_unknown.dwarf_aa461::CreateCompareNotEqual(module,pSVar1,pVVar3,pVVar9);
    }
    if (local_c0 == (VmValue *)0x0) {
      __assert_fail("result",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xbcc,
                    "VmValue *CompileVmBinaryOp(ExpressionContext &, VmModule *, ExprBinaryOp *)");
    }
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,local_c0);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmBinaryOp(ExpressionContext &ctx, VmModule *module, ExprBinaryOp *node)
{
	VmValue *lhs = CompileVm(ctx, module, node->lhs);

	if(node->op == SYN_BINARY_OP_LOGICAL_AND)
	{
		VmBlock *checkRhsBlock = CreateBlock(module, node->source, "land_check_rhs");
		VmBlock *storeOneBlock = CreateBlock(module, node->source, "land_store_1");
		VmBlock *storeZeroBlock = CreateBlock(module, node->source, "land_store_0");
		VmBlock *exitBlock = CreateBlock(module, node->source, "land_exit");

		CreateJumpZero(module, node->source, lhs, storeZeroBlock, checkRhsBlock);

		module->currentFunction->AddBlock(checkRhsBlock);
		module->currentBlock = checkRhsBlock;

		VmValue *rhs = CompileVm(ctx, module, node->rhs);

		CreateJumpZero(module, node->source, rhs, storeZeroBlock, storeOneBlock);

		module->currentFunction->AddBlock(storeOneBlock);
		module->currentBlock = storeOneBlock;

		VmValue *trueValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 1));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(storeZeroBlock);
		module->currentBlock = storeZeroBlock;

		VmValue *falseValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 0));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(exitBlock);
		module->currentBlock = exitBlock;

		VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

		return CheckType(ctx, node, phi);
	}

	if(node->op == SYN_BINARY_OP_LOGICAL_OR)
	{
		VmBlock *checkRhsBlock = CreateBlock(module, node->source, "lor_check_rhs");
		VmBlock *storeOneBlock = CreateBlock(module, node->source, "lor_store_1");
		VmBlock *storeZeroBlock = CreateBlock(module, node->source, "lor_store_0");
		VmBlock *exitBlock = CreateBlock(module, node->source, "lor_exit");

		CreateJumpNotZero(module, node->source, lhs, storeOneBlock, checkRhsBlock);

		module->currentFunction->AddBlock(checkRhsBlock);
		module->currentBlock = checkRhsBlock;

		VmValue *rhs = CompileVm(ctx, module, node->rhs);

		CreateJumpNotZero(module, node->source, rhs, storeOneBlock, storeZeroBlock);

		module->currentFunction->AddBlock(storeOneBlock);
		module->currentBlock = storeOneBlock;

		VmValue *trueValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 1));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(storeZeroBlock);
		module->currentBlock = storeZeroBlock;

		VmValue *falseValue = CreateLoadImmediate(module, node->source, CreateConstantInt(module->allocator, node->source, 0));

		CreateJump(module, node->source, exitBlock);

		module->currentFunction->AddBlock(exitBlock);
		module->currentBlock = exitBlock;

		VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

		return CheckType(ctx, node, phi);
	}

	VmValue *rhs = CompileVm(ctx, module, node->rhs);

	VmValue *result = NULL;

	switch(node->op)
	{
	case SYN_BINARY_OP_ADD:
		result = CreateAdd(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SUB:
		result = CreateSub(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_MUL:
		result = CreateMul(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_DIV:
		result = CreateDiv(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_MOD:
		result = CreateMod(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_POW:
		result = CreatePow(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SHL:
		result = CreateShl(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_SHR:
		result = CreateShr(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LESS:
		result = CreateCompareLess(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LESS_EQUAL:
		result = CreateCompareLessEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_GREATER:
		result = CreateCompareGreater(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_GREATER_EQUAL:
		result = CreateCompareGreaterEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_EQUAL:
		result = CreateCompareEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_NOT_EQUAL:
		result = CreateCompareNotEqual(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_AND:
		result = CreateAnd(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_OR:
		result = CreateOr(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_BIT_XOR:
		result = CreateXor(module, node->source, lhs, rhs);
		break;
	case SYN_BINARY_OP_LOGICAL_XOR:
		result = CreateCompareNotEqual(module, node->source, CreateCompareNotEqual(module, node->source, lhs, CreateConstantZero(module->allocator, node->source, lhs->type)), CreateCompareNotEqual(module, node->source, rhs, CreateConstantZero(module->allocator, node->source, rhs->type)));
		break;
	default:
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}